

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPointCollector.h
# Opt level: O2

void __thiscall
btPointCollector::addContactPoint
          (btPointCollector *this,btVector3 *normalOnBInWorld,btVector3 *pointInWorld,btScalar depth
          )

{
  undefined8 uVar1;
  
  if (depth < this->m_distance) {
    this->m_hasResult = true;
    uVar1 = *(undefined8 *)(normalOnBInWorld->m_floats + 2);
    *(undefined8 *)(this->m_normalOnBInWorld).m_floats = *(undefined8 *)normalOnBInWorld->m_floats;
    *(undefined8 *)((this->m_normalOnBInWorld).m_floats + 2) = uVar1;
    uVar1 = *(undefined8 *)(pointInWorld->m_floats + 2);
    *(undefined8 *)(this->m_pointInWorld).m_floats = *(undefined8 *)pointInWorld->m_floats;
    *(undefined8 *)((this->m_pointInWorld).m_floats + 2) = uVar1;
    this->m_distance = depth;
  }
  return;
}

Assistant:

virtual void addContactPoint(const btVector3& normalOnBInWorld,const btVector3& pointInWorld,btScalar depth)
	{
		if (depth< m_distance)
		{
			m_hasResult = true;
			m_normalOnBInWorld = normalOnBInWorld;
			m_pointInWorld = pointInWorld;
			//negative means penetration
			m_distance = depth;
		}
	}